

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O3

void absl::RemoveExtraAsciiWhitespace(Nonnull<std::string_*> str)

{
  size_t sVar1;
  byte *pbVar2;
  byte *pbVar3;
  char *in_RDX;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  string_view sVar8;
  
  sVar8._M_str = in_RDX;
  sVar8._M_len = (size_t)(str->_M_dataplus)._M_p;
  sVar8 = StripAsciiWhitespace((absl *)str->_M_string_length,sVar8);
  pbVar3 = (byte *)sVar8._M_str;
  sVar1 = sVar8._M_len;
  if (sVar1 == 0) {
    str->_M_string_length = 0;
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
  }
  else {
    pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    pbVar4 = pbVar2;
    if (0 < (long)sVar1) {
      pbVar2 = pbVar3 + sVar1;
      bVar6 = 0;
      do {
        bVar7 = ((&ascii_internal::kPropertyBits)[*pbVar3] & 8) >> 3;
        pbVar4[-(ulong)(bVar6 & bVar7)] = *pbVar3;
        pbVar4 = pbVar4 + -(ulong)(bVar6 & bVar7) + 1;
        pbVar3 = pbVar3 + 1;
        bVar6 = bVar7;
      } while (pbVar3 < pbVar2);
      pbVar2 = (byte *)(str->_M_dataplus)._M_p;
    }
    uVar5 = (long)pbVar4 - (long)pbVar2;
    if (str->_M_string_length < uVar5) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
    }
    str->_M_string_length = uVar5;
    pbVar2 = pbVar2 + uVar5;
  }
  *pbVar2 = 0;
  return;
}

Assistant:

void RemoveExtraAsciiWhitespace(absl::Nonnull<std::string*> str) {
  auto stripped = StripAsciiWhitespace(*str);

  if (stripped.empty()) {
    str->clear();
    return;
  }

  auto input_it = stripped.begin();
  auto input_end = stripped.end();
  auto output_it = &(*str)[0];
  bool is_ws = false;

  for (; input_it < input_end; ++input_it) {
    if (is_ws) {
      // Consecutive whitespace?  Keep only the last.
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
      if (is_ws) --output_it;
    } else {
      is_ws = absl::ascii_isspace(static_cast<unsigned char>(*input_it));
    }

    *output_it = *input_it;
    ++output_it;
  }

  str->erase(static_cast<size_t>(output_it - &(*str)[0]));
}